

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdrag.cpp
# Opt level: O1

QDrag * __thiscall QPlatformDrag::currentDrag(QPlatformDrag *this)

{
  Data *pDVar1;
  QObject *pQVar2;
  QDragManager *pQVar3;
  QObject *pQVar4;
  
  pQVar3 = QDragManager::self();
  pDVar1 = (pQVar3->m_object).wp.d;
  if (pDVar1 == (Data *)0x0) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar2 = (pQVar3->m_object).wp.value;
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar4 = (QObject *)0x0;
    if ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
      pQVar4 = pQVar2;
    }
  }
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar1);
    }
  }
  return (QDrag *)pQVar4;
}

Assistant:

QDrag *QPlatformDrag::currentDrag() const
{
    return QDragManager::self()->object();
}